

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

void __thiscall
spvtools::opt::SpreadVolatileSemantics::CollectTargetsForVolatileSemantics
          (SpreadVolatileSemantics *this,bool is_vk_memory_model_enabled)

{
  Module *pMVar1;
  Instruction *this_00;
  bool bVar2;
  ExecutionModel execution_model;
  uint32_t uVar3;
  uint32_t operand_index;
  uint32_t index;
  Instruction *entry_point;
  Instruction **ppIVar4;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar4 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  do {
    this_00 = *ppIVar4;
    if (this_00 ==
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
      return;
    }
    execution_model = Instruction::GetSingleWordInOperand(this_00,0);
    index = 3;
    while( true ) {
      uVar3 = Instruction::NumInOperands(this_00);
      if (uVar3 <= index) break;
      uVar3 = Instruction::GetSingleWordInOperand(this_00,index);
      bVar2 = IsTargetForVolatileSemantics(this,uVar3,execution_model);
      if (bVar2) {
        if (!is_vk_memory_model_enabled) {
          bVar2 = IsTargetUsedByNonVolatileLoadInEntryPoint(this,uVar3,this_00);
          if (!bVar2) goto LAB_0046108f;
        }
        MarkVolatileSemanticsForVariable(this,uVar3,this_00);
      }
LAB_0046108f:
      index = index + 1;
    }
    ppIVar4 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void SpreadVolatileSemantics::CollectTargetsForVolatileSemantics(
    const bool is_vk_memory_model_enabled) {
  for (Instruction& entry_point : get_module()->entry_points()) {
    spv::ExecutionModel execution_model =
        static_cast<spv::ExecutionModel>(entry_point.GetSingleWordInOperand(0));
    for (uint32_t operand_index = kOpEntryPointInOperandInterface;
         operand_index < entry_point.NumInOperands(); ++operand_index) {
      uint32_t var_id = entry_point.GetSingleWordInOperand(operand_index);
      if (!IsTargetForVolatileSemantics(var_id, execution_model)) {
        continue;
      }
      if (is_vk_memory_model_enabled ||
          IsTargetUsedByNonVolatileLoadInEntryPoint(var_id, &entry_point)) {
        MarkVolatileSemanticsForVariable(var_id, &entry_point);
      }
    }
  }
}